

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  LogMessage *other_00;
  undefined1 local_80 [8];
  RepeatedPtrFieldBase temp;
  LogMessage local_50;
  RepeatedPtrFieldBase *local_18;
  RepeatedPtrFieldBase *other_local;
  RepeatedPtrFieldBase *this_local;
  
  local_18 = other;
  other_local = this;
  pAVar1 = GetArena(other);
  pAVar2 = GetArena(this);
  if (pAVar1 == pAVar2) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x342);
    other_00 = LogMessage::operator<<(&local_50,"CHECK failed: other->GetArena() != GetArena(): ");
    LogFinisher::operator=((LogFinisher *)((long)&temp.rep_ + 3),other_00);
    LogMessage::~LogMessage(&local_50);
  }
  pAVar1 = GetArena(local_18);
  RepeatedPtrFieldBase((RepeatedPtrFieldBase *)local_80,pAVar1);
  MergeFrom<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            ((RepeatedPtrFieldBase *)local_80,this);
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(this);
  MergeFrom<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            (this,local_18);
  InternalSwap(local_18,(RepeatedPtrFieldBase *)local_80);
  Destroy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            ((RepeatedPtrFieldBase *)local_80);
  ~RepeatedPtrFieldBase((RepeatedPtrFieldBase *)local_80);
  return;
}

Assistant:

void RepeatedPtrFieldBase::SwapFallback(RepeatedPtrFieldBase* other) {
#ifdef PROTOBUF_FORCE_COPY_IN_SWAP
  GOOGLE_DCHECK(GetArena() == nullptr || other->GetArena() != GetArena());
#else   // PROTOBUF_FORCE_COPY_IN_SWAP
  GOOGLE_DCHECK(other->GetArena() != GetArena());
#endif  // !PROTOBUF_FORCE_COPY_IN_SWAP

  // Copy semantics in this case. We try to improve efficiency by placing the
  // temporary on |other|'s arena so that messages are copied twice rather than
  // three times.
  RepeatedPtrFieldBase temp(other->GetArena());
  temp.MergeFrom<TypeHandler>(*this);
  this->Clear<TypeHandler>();
  this->MergeFrom<TypeHandler>(*other);
  other->InternalSwap(&temp);
  temp.Destroy<TypeHandler>();  // Frees rep_ if `other` had no arena.
}